

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3423.h
# Opt level: O3

void __thiscall
chrono::fea::ChElementShellANCF_3423::GetSubBlockOffset(ChElementShellANCF_3423 *this)

{
  return;
}

Assistant:

virtual unsigned int GetSubBlockOffset(int nblock) override { return m_nodes[nblock]->NodeGetOffset_w(); }